

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextVkImpl::TraceRaysIndirect
          (DeviceContextVkImpl *this,TraceRaysIndirectAttribs *Attribs)

{
  ResourceBindInfo *BindInfo;
  Uint32 *pUVar1;
  IShaderBindingTable *pSrcPtr;
  Uint64 UVar2;
  BufferVkImpl *this_00;
  VkDeviceAddress VVar3;
  uint CommitSRBMask;
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::TraceRaysIndirect
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,Attribs,0);
  pSrcPtr = Attribs->pSBT;
  if (pSrcPtr != (IShaderBindingTable *)0x0) {
    CheckDynamicType<Diligent::ShaderBindingTableVkImpl_const,Diligent::IShaderBindingTable_const>
              (pSrcPtr);
  }
  this_00 = PrepareIndirectAttribsBuffer
                      (this,Attribs->pAttribsBuffer,Attribs->AttribsBufferStateTransitionMode,
                       "Trace rays indirect (DeviceContextVkImpl::TraceRaysIndirect)");
  UVar2 = Attribs->ArgsByteOffset;
  EnsureVkCmdBuffer(this);
  BindInfo = (this->m_BindInfo)._M_elems + 2;
  DeviceContextBase<Diligent::EngineVkImplTraits>::CommittedShaderResources::DvpVerifyCacheRevisions
            (&BindInfo->super_CommittedShaderResources);
  CommitSRBMask =
       (uint)((this->m_BindInfo)._M_elems[2].super_CommittedShaderResources.ActiveSRBMask &
             ((this->m_BindInfo)._M_elems[2].super_CommittedShaderResources.StaleSRBMask |
             (this->m_BindInfo)._M_elems[2].super_CommittedShaderResources.DynamicSRBMask));
  if (CommitSRBMask != 0) {
    CommitDescriptorSets(this,BindInfo,CommitSRBMask);
  }
  DvpValidateCommittedShaderResources(this,BindInfo);
  VVar3 = BufferVkImpl::GetVkDeviceAddress(this_00);
  VulkanUtilities::VulkanCommandBuffer::TraceRaysIndirect
            (&this->m_CommandBuffer,(VkStridedDeviceAddressRegionKHR *)(pSrcPtr + 0x1a),
             (VkStridedDeviceAddressRegionKHR *)(pSrcPtr + 0x1d),
             (VkStridedDeviceAddressRegionKHR *)(pSrcPtr + 0x20),
             (VkStridedDeviceAddressRegionKHR *)(pSrcPtr + 0x23),UVar2 + VVar3 + 0x58);
  pUVar1 = &(this->m_State).NumCommands;
  *pUVar1 = *pUVar1 + 1;
  return;
}

Assistant:

void DeviceContextVkImpl::TraceRaysIndirect(const TraceRaysIndirectAttribs& Attribs)
{
    TDeviceContextBase::TraceRaysIndirect(Attribs, 0);

    const ShaderBindingTableVkImpl* pSBTVk       = ClassPtrCast<const ShaderBindingTableVkImpl>(Attribs.pSBT);
    const BindingTableVk&           BindingTable = pSBTVk->GetVkBindingTable();

    BufferVkImpl* const pIndirectAttribsVk = PrepareIndirectAttribsBuffer(Attribs.pAttribsBuffer, Attribs.AttribsBufferStateTransitionMode, "Trace rays indirect (DeviceContextVkImpl::TraceRaysIndirect)");
    const Uint64        IndirectBuffOffset = Attribs.ArgsByteOffset + TraceRaysIndirectCommandSBTSize;

    PrepareForRayTracing();
    m_CommandBuffer.TraceRaysIndirect(BindingTable.RaygenShader, BindingTable.MissShader, BindingTable.HitShader, BindingTable.CallableShader,
                                      pIndirectAttribsVk->GetVkDeviceAddress() + IndirectBuffOffset);
    ++m_State.NumCommands;
}